

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

int __thiscall Jupiter::Socket::bind(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  addrinfo **ppaVar1;
  ushort uVar2;
  size_type __len1;
  char *__name;
  bool bVar3;
  addrinfo *__ai;
  int iVar4;
  uint extraout_EAX;
  size_t __len2;
  Data *extraout_RAX;
  Data *pDVar5;
  undefined4 in_register_00000034;
  uint uVar6;
  addrinfo *paVar7;
  addrinfo *ptr;
  string __str;
  char local_5c;
  addrinfo *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pDVar5 = this->m_data;
  __len1 = (pDVar5->bound_host)._M_string_length;
  __len2 = strlen((char *)CONCAT44(in_register_00000034,__fd));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&pDVar5->bound_host,0,__len1,(char *)CONCAT44(in_register_00000034,__fd),__len2);
  pDVar5 = this->m_data;
  pDVar5->bound_port = (unsigned_short)__addr;
  __name = (pDVar5->bound_host)._M_dataplus._M_p;
  uVar2 = pDVar5->bound_port;
  uVar6 = 1;
  if (((9 < uVar2) && (uVar6 = 2, 99 < uVar2)) && (uVar6 = 3, 999 < uVar2)) {
    uVar6 = 5 - (uVar2 < 10000);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_50,(ulong)uVar6,'-');
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50._M_dataplus._M_p,uVar6,(uint)uVar2);
  local_58 = (addrinfo *)0x0;
  getaddrinfo(__name,local_50._M_dataplus._M_p,(addrinfo *)0x0,&local_58);
  __ai = local_58;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  paVar7 = __ai;
  if (__ai != (addrinfo *)0x0) {
    do {
      iVar4 = socket(paVar7->ai_family,this->m_data->sockType,this->m_data->sockProto);
      this->m_data->rawSock = iVar4;
      if (iVar4 != -1) {
        iVar4 = ::bind(iVar4,paVar7->ai_addr,paVar7->ai_addrlen);
        if (iVar4 != -1) {
          freeaddrinfo(__ai);
          local_5c = (char)__len;
          pDVar5 = extraout_RAX;
          if ((local_5c == '\0') || (pDVar5 = this->m_data, pDVar5->sockType != 1)) {
LAB_00138217:
            uVar6 = (uint)CONCAT71((int7)((ulong)pDVar5 >> 8),1);
          }
          else {
            uVar6 = listen(pDVar5->rawSock,0x1000);
            pDVar5 = (Data *)(ulong)uVar6;
            if (uVar6 != 0xffffffff) goto LAB_00138217;
            uVar6 = 0;
          }
          bVar3 = false;
          goto LAB_0013821b;
        }
        ::close(this->m_data->rawSock);
        this->m_data->rawSock = -1;
      }
      ppaVar1 = &paVar7->ai_next;
      paVar7 = *ppaVar1;
    } while (*ppaVar1 != (addrinfo *)0x0);
    freeaddrinfo(__ai);
    bVar3 = true;
    uVar6 = extraout_EAX;
LAB_0013821b:
    if (!bVar3) goto LAB_00138221;
  }
  uVar6 = 0;
LAB_00138221:
  return uVar6 & 0xffffff01;
}

Assistant:

bool Jupiter::Socket::bind(const char *hostname, unsigned short iPort, bool andListen) {
#if defined _WIN32
	if (!socketInit && !Jupiter::Socket::init()) {
		return false;
	}
#endif // _WIN32
	m_data->bound_host = hostname;
	m_data->bound_port = iPort;
	addrinfo *info_head = Jupiter::Socket::getAddrInfo(m_data->bound_host.c_str(), std::to_string(m_data->bound_port).c_str());
	if (info_head != nullptr) {
		addrinfo *info = info_head;
		do {
			m_data->rawSock = socket(info->ai_family, m_data->sockType, m_data->sockProto);
			if (m_data->rawSock == INVALID_SOCKET) {
				info = info->ai_next;
				continue;
			}

			if (::bind(m_data->rawSock, info->ai_addr, info->ai_addrlen) == SOCKET_ERROR) {
#if defined _WIN32
				::closesocket(m_data->rawSock);
#else // _WIN32
				::close(m_data->rawSock);
#endif // WIN32
				m_data->rawSock = INVALID_SOCKET;
				info = info->ai_next;
				continue;
			}

			Jupiter::Socket::freeAddrInfo(info_head);
			if (andListen && m_data->sockType == SOCK_STREAM && ::listen(m_data->rawSock, SOMAXCONN) == SOCKET_ERROR) {
				return false;
			}

			return true;
		} while (info != nullptr);
		Jupiter::Socket::freeAddrInfo(info_head);
	}
	return false;
}